

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

uint __thiscall capnp::Type::hashCode(Type *this)

{
  uint uVar1;
  uint16_t val;
  unsigned_short local_2;
  
  switch(this->baseType) {
  case VOID:
  case BOOL:
  case INT8:
  case INT16:
  case INT32:
  case INT64:
  case UINT8:
  case UINT16:
  case UINT32:
  case UINT64:
  case FLOAT32:
  case FLOAT64:
  case TEXT:
  case DATA:
    break;
  default:
    kj::_::unreachable();
  case ENUM:
  case STRUCT:
  case INTERFACE:
    if (this->listDepth != '\0') {
      uVar1 = kj::hashCode<capnp::_::RawBrandedSchema_const*const&,unsigned_char_const&>
                        (&(this->field_4).schema,&this->listDepth);
      return uVar1;
    }
    uVar1 = kj::hashCode<capnp::_::RawBrandedSchema_const*const&>(&(this->field_4).schema);
    return uVar1;
  case ANY_POINTER:
    uVar1 = kj::hashCode<unsigned_short&,bool_const&,unsigned_long_const&,unsigned_char_const&>
                      (&local_2,&this->isImplicitParam,&(this->field_4).scopeId,&this->listDepth);
    return uVar1;
  }
  if (this->listDepth != '\0') {
    uVar1 = kj::hashCode<capnp::schema::Type::Which_const&,unsigned_char_const&>
                      (&this->baseType,&this->listDepth);
    return uVar1;
  }
  uVar1 = kj::hashCode<capnp::schema::Type::Which_const&>(&this->baseType);
  return uVar1;
}

Assistant:

uint Type::hashCode() const {
  switch (baseType) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      if (listDepth == 0) {
        // Make sure that hashCode(Type(baseType)) == hashCode(baseType), otherwise HashMap lookups
        // keyed by `Type` won't work when the caller passes `baseType` as the key.
        return kj::hashCode(baseType);
      } else {
        return kj::hashCode(baseType, listDepth);
      }

    case schema::Type::STRUCT:
    case schema::Type::ENUM:
    case schema::Type::INTERFACE:
      if (listDepth == 0) {
        // Make sure that hashCode(Type(schema)) == hashCode(schema), otherwise HashMap lookups
        // keyed by `Type` won't work when the caller passes `schema` as the key.
        return kj::hashCode(schema);
      } else {
        return kj::hashCode(schema, listDepth);
      }

    case schema::Type::LIST:
      KJ_UNREACHABLE;

    case schema::Type::ANY_POINTER: {
      // Trying to comply with strict aliasing rules. Hopefully the compiler realizes that
      // both branches compile to the same instructions and can optimize it away.
      uint16_t val = scopeId != 0 || isImplicitParam ?
          paramIndex : static_cast<uint16_t>(anyPointerKind);
      return kj::hashCode(val, isImplicitParam, scopeId, listDepth);
    }
  }

  KJ_UNREACHABLE;
}